

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void lowbd_inv_txfm2d_8x8_no_identity_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  byte in_CL;
  byte in_R8B;
  int in_R9D;
  __m128i *_buf1;
  __m128i *buf0_cur;
  __m128i buf0 [8];
  int lr_flip;
  int ud_flip;
  transform_1d_ssse3 col_txfm;
  transform_1d_ssse3 row_txfm;
  int8_t *shift;
  int input_stride;
  __m128i buf1 [8];
  int in_stack_000001f0;
  int in_stack_000001f4;
  uint8_t *in_stack_000001f8;
  int in_stack_00000204;
  __m128i *in_stack_00000208;
  longlong local_158 [17];
  int local_d0;
  int local_cc;
  transform_1d_ssse3 local_c8;
  transform_1d_ssse3 local_c0;
  int8_t *local_b8;
  undefined4 local_ac;
  longlong local_a8 [21];
  
  local_ac = 8;
  local_b8 = av1_inv_txfm_shift_ls[in_R8B];
  local_c0 = lowbd_txfm_all_1d_zeros_8x8_arr[""[in_CL]][(int)(uint)(in_R9D != 1)];
  local_c8 = lowbd_txfm_all_1d_zeros_8x8_arr[""[in_CL]][(int)(uint)(in_R9D != 1)];
  get_flip_cfg(in_CL,&local_cc,&local_d0);
  load_buffer_avx2((int32_t *)row_txfm,col_txfm._4_4_,_lr_flip);
  (*local_c0)((__m128i *)local_158,(__m128i *)local_158);
  round_and_transpose_avx2
            ((__m128i *)buf1[2][1],(__m128i *)buf1[2][0],buf1[1][1]._4_4_,(int *)buf1[1][0]);
  (*local_c8)((__m128i *)local_a8,(__m128i *)local_a8);
  round_shift_lowbd_write_buffer_avx2
            (in_stack_00000208,in_stack_00000204,in_stack_000001f8,in_stack_000001f4,
             in_stack_000001f0);
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_8x8_no_identity_avx2(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  __m128i buf1[8];
  const int input_stride = 8;
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  assert(hitx_1d_tab[tx_type] < 2);
  assert(vitx_1d_tab[tx_type] < 2);
  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_zeros_8x8_arr[hitx_1d_tab[tx_type]][eob != 1];
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_zeros_8x8_arr[vitx_1d_tab[tx_type]][eob != 1];

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  __m128i buf0[8];
  __m128i *buf0_cur = buf0;
  load_buffer_avx2(input, input_stride, buf0_cur);
  row_txfm(buf0, buf0);

  assert(shift[0] < 0);
  __m128i *_buf1 = buf1;
  round_and_transpose_avx2(buf0, _buf1, shift[0], &lr_flip);
  assert(shift[1] < 0);
  col_txfm(buf1, buf1);
  round_shift_lowbd_write_buffer_avx2(buf1, shift[1], output, stride, ud_flip);
}